

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

int __thiscall Js::JavascriptBigInt::Compare(JavascriptBigInt *this,JavascriptBigInt *pbi)

{
  int iVar1;
  int iVar2;
  int sign;
  JavascriptBigInt *pbi_local;
  JavascriptBigInt *this_local;
  
  if ((this->m_isNegative & 1U) == (pbi->m_isNegative & 1U)) {
    iVar1 = 1;
    if ((this->m_isNegative & 1U) != 0) {
      iVar1 = -1;
    }
    iVar2 = CompareAbsolute(this,pbi);
    this_local._4_4_ = iVar1 * iVar2;
  }
  else if ((this->m_isNegative & 1U) == 0) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int JavascriptBigInt::Compare(JavascriptBigInt *pbi)
    {
        if (m_isNegative != pbi->m_isNegative)
        {
            if (m_isNegative)
            {
                return -1;
            }
            else
            {
                return 1;
            }
        }

        int sign = m_isNegative ? -1 : 1;
        return sign * JavascriptBigInt::CompareAbsolute(pbi);
    }